

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_txin_txinreference.cpp
# Opt level: O3

void __thiscall TxIn_EstimateTxInVsize_Test::TestBody(TxIn_EstimateTxInVsize_Test *this)

{
  AddressType AVar1;
  Script SVar2;
  pointer pTVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  pointer pTVar7;
  char *message;
  initializer_list<TestEstimateTxInSizeVector> __l;
  uint32_t vsize;
  AssertionResult gtest_ar;
  undefined1 in_stack_fffffffffffffda8 [12];
  uint uVar8;
  undefined1 in_stack_fffffffffffffdb8 [16];
  AssertHelper in_stack_fffffffffffffdc8;
  undefined1 in_stack_fffffffffffffdd0 [16];
  undefined1 local_218 [16];
  Script local_208;
  undefined8 local_1d0;
  undefined4 local_1c8;
  Script local_1c0;
  undefined8 local_188;
  undefined4 local_180;
  Script local_178;
  undefined8 local_140;
  undefined4 local_138;
  Script local_130;
  undefined8 local_f8;
  undefined4 local_f0;
  Script local_e8;
  undefined8 local_b0;
  undefined4 local_a8;
  Script local_a0;
  Script local_68;
  
  if (TestBody()::test_vector == '\0') {
    iVar5 = __cxa_guard_acquire(&TestBody()::test_vector);
    if (iVar5 != 0) {
      local_218._0_8_ = (long *)0x9600000002;
      local_218._8_4_ = 0;
      cfd::core::Script::Script(&local_208);
      local_1d0 = 0xd000000001;
      local_1c8 = 0;
      cfd::core::Script::Script(&local_1c0,&exp_script);
      local_188 = 0x5c00000006;
      local_180 = 0;
      cfd::core::Script::Script(&local_178);
      local_140 = 0x7000000005;
      local_138 = 0;
      in_stack_fffffffffffffdc8.data_ = (AssertHelperData *)&stack0xfffffffffffffdd8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&stack0xfffffffffffffdc8,"51","");
      cfd::core::Script::Script(&local_130,(string *)&stack0xfffffffffffffdc8);
      local_f8 = 0x4500000004;
      local_f0 = 0;
      cfd::core::Script::Script(&local_e8);
      local_b0 = 0x5300000003;
      local_a8 = 0;
      cfd::core::Script::Script(&local_a0,&exp_script);
      __l._M_len = 6;
      __l._M_array = (iterator)local_218;
      std::vector<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>::vector
                (&TestBody::test_vector,__l,(allocator_type *)&stack0xfffffffffffffdc0);
      lVar6 = 0x178;
      do {
        cfd::core::Script::~Script((Script *)(local_218 + lVar6));
        lVar6 = lVar6 + -0x48;
      } while (lVar6 != -0x38);
      if (in_stack_fffffffffffffdc8.data_ != (AssertHelperData *)&stack0xfffffffffffffdd8) {
        operator_delete(in_stack_fffffffffffffdc8.data_);
      }
      __cxa_atexit(std::
                   vector<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>::
                   ~vector,&TestBody::test_vector,&__dso_handle);
      __cxa_guard_release(&TestBody()::test_vector);
    }
  }
  pTVar3 = TestBody::test_vector.
           super__Vector_base<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (TestBody::test_vector.
      super__Vector_base<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      TestBody::test_vector.
      super__Vector_base<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pTVar7 = TestBody::test_vector.
             super__Vector_base<TestEstimateTxInSizeVector,_std::allocator<TestEstimateTxInSizeVector>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      uVar8 = 0;
      bVar4 = testing::internal::AlwaysTrue();
      if (bVar4) {
        bVar4 = testing::internal::AlwaysTrue();
        if (bVar4) {
          AVar1 = pTVar7->addr_type;
          cfd::core::Script::Script(&local_68,&pTVar7->redeem_script);
          SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          ._M_impl.super__Vector_impl_data._M_start._4_4_ = uVar8;
          SVar2._0_12_ = in_stack_fffffffffffffda8;
          SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffdb8._0_8_;
          SVar2.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)in_stack_fffffffffffffdb8._8_8_;
          SVar2.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)in_stack_fffffffffffffdc8.data_;
          SVar2.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffdd0._0_8_;
          SVar2.script_stack_.
          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)in_stack_fffffffffffffdd0._8_8_;
          cfd::core::TxIn::EstimateTxInVsize(AVar1,SVar2,&local_68);
          cfd::core::Script::~Script(&local_68);
        }
      }
      else {
        testing::Message::Message((Message *)local_218);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffdc8,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_txin_txinreference.cpp"
                   ,0x52,
                   "Expected: (vsize = TxIn::EstimateTxInVsize( test_data.addr_type, test_data.redeem_script)) doesn\'t throw an exception.\n  Actual: it throws."
                  );
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffdc8,(Message *)local_218);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffdc8);
        if ((long *)local_218._0_8_ != (long *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && ((long *)local_218._0_8_ != (long *)0x0)) {
            (**(code **)(*(long *)local_218._0_8_ + 8))();
          }
        }
      }
      testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
                ((internal *)local_218,"vsize","test_data.size",(uint *)&stack0xfffffffffffffdb4,
                 &pTVar7->size);
      if (local_218[0] == (internal)0x0) {
        testing::Message::Message((Message *)&stack0xfffffffffffffdc8);
        message = "";
        if ((undefined8 *)CONCAT44(local_218._12_4_,local_218._8_4_) != (undefined8 *)0x0) {
          message = *(char **)CONCAT44(local_218._12_4_,local_218._8_4_);
        }
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&stack0xfffffffffffffdc0,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_txin_txinreference.cpp"
                   ,0x53,message);
        testing::internal::AssertHelper::operator=
                  ((AssertHelper *)&stack0xfffffffffffffdc0,(Message *)&stack0xfffffffffffffdc8);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffdc0);
        if (in_stack_fffffffffffffdc8.data_ != (AssertHelperData *)0x0) {
          bVar4 = testing::internal::IsTrue(true);
          if ((bVar4) && (in_stack_fffffffffffffdc8.data_ != (AssertHelperData *)0x0)) {
            (**(code **)(*(long *)in_stack_fffffffffffffdc8.data_ + 8))();
          }
        }
      }
      testing::internal::
      scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)(local_218 + 8),
            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      pTVar7 = pTVar7 + 1;
    } while (pTVar7 != pTVar3);
  }
  return;
}

Assistant:

TEST(TxIn, EstimateTxInVsize) {
  static const std::vector<TestEstimateTxInSizeVector> test_vector = {
    {AddressType::kP2pkhAddress, 150, 0, Script()},
    {AddressType::kP2shAddress, 208, 0, exp_script},
    {AddressType::kP2shP2wpkhAddress, 92, 0, Script()},
    {AddressType::kP2shP2wshAddress, 112, 0, Script("51")},
    {AddressType::kP2wpkhAddress, 69, 0, Script()},
    {AddressType::kP2wshAddress, 83, 0, exp_script},
  };

  for (const auto& test_data : test_vector) {
    uint32_t vsize = 0;
    EXPECT_NO_THROW((vsize = TxIn::EstimateTxInVsize(
        test_data.addr_type, test_data.redeem_script)));
    EXPECT_EQ(vsize, test_data.size);
  }
}